

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

int __thiscall c4::basic_substring<char>::compare(basic_substring<char> *this,char *that,size_t sz)

{
  char *pcVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  
  if (sz != 0 && that == (char *)0x0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      iVar5 = (*pcVar3)();
      return iVar5;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14de,"that || sz == 0");
  }
  pcVar1 = this->str;
  if ((pcVar1 == (char *)0x0) && (this->len != 0)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      iVar5 = (*pcVar3)();
      return iVar5;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14df,"str || len == 0");
  }
  uVar2 = this->len;
  if ((that == (char *)0x0) || (pcVar1 == (char *)0x0)) {
    uVar7 = 0;
    if (uVar2 == sz) {
      if (sz != 0) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar3 = (code *)swi(3);
          iVar5 = (*pcVar3)();
          return iVar5;
        }
        handle_error(0x1fa937,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14f1,"len == 0 && sz == 0");
      }
    }
    else {
      uVar7 = -(uint)(uVar2 < sz) | 1;
    }
  }
  else {
    sVar6 = sz;
    if (uVar2 < sz) {
      sVar6 = uVar2;
    }
    if (sVar6 != 0) {
      uVar8 = 0;
      do {
        if (pcVar1[uVar8] != that[uVar8]) {
          return (uint)(that[uVar8] <= pcVar1[uVar8]) * 2 + -1;
        }
        uVar8 = uVar8 + 1;
      } while (sVar6 != uVar8);
    }
    uVar7 = 0xffffffff;
    if (sz <= uVar2) {
      uVar7 = (uint)(uVar2 != sz);
    }
  }
  return uVar7;
}

Assistant:

C4_PURE int compare(const char *C4_RESTRICT that, size_t sz) const noexcept
    {
        C4_XASSERT(that || sz  == 0);
        C4_XASSERT(str  || len == 0);
        if(C4_LIKELY(str && that))
        {
            {
                const size_t min = len < sz ? len : sz;
                for(size_t i = 0; i < min; ++i)
                    if(str[i] != that[i])
                        return str[i] < that[i] ? -1 : 1;
            }
            if(len < sz)
                return -1;
            else if(len == sz)
                return 0;
            else
                return 1;
        }
        else if(len == sz)
        {
            C4_XASSERT(len == 0 && sz == 0);
            return 0;
        }
        return len < sz ? -1 : 1;
    }